

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O3

bool __thiscall
brotli::BrotliCompressor::WriteBrotliData
          (BrotliCompressor *this,bool is_last,bool force_flush,size_t *out_size,uint8_t **output)

{
  uint uVar1;
  Command *pCVar2;
  uint8_t *storage;
  int *table;
  ulong uVar3;
  Command *pCVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  int quality;
  uint64_t uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  size_t table_size;
  size_t *local_60;
  ulong local_58;
  ulong local_50;
  size_t storage_ix;
  uint64_t uStack_40;
  uint32_t local_38;
  uint16_t uStack_34;
  uint16_t uStack_32;
  
  uVar10 = this->last_processed_pos_;
  uVar9 = this->input_pos_ - uVar10;
  uVar11 = 1L << ((byte)(this->params_).lgblock & 0x3f);
  if (uVar9 <= uVar11) {
    puVar12 = this->ringbuffer_->buffer_;
    uVar1 = this->ringbuffer_->mask_;
    quality = (this->params_).quality;
    if (quality < 2) {
      if (this->input_pos_ == uVar10 && !is_last) {
        *out_size = 0;
      }
      else {
        storage = GetBrotliStorage(this,(ulong)((int)uVar9 * 2 + 500));
        *storage = this->last_byte_;
        storage_ix = (size_t)this->last_byte_bits_;
        uVar3 = uVar9 & 0xffffffff;
        table = GetHashTable(this,(this->params_).quality,uVar3,&table_size);
        uVar5 = (uint)this->last_processed_pos_;
        uVar8 = uVar5 & 0x3fffffff | 0x40000000;
        if (this->last_processed_pos_ < 0x40000001) {
          uVar8 = uVar5;
        }
        puVar12 = puVar12 + (uVar8 & uVar1);
        if ((this->params_).quality == 0) {
          BrotliCompressFragmentFast
                    (puVar12,uVar3,is_last,table,table_size,this->cmd_depths_,this->cmd_bits_,
                     &this->cmd_code_numbits_,this->cmd_code_,&storage_ix,storage);
        }
        else {
          BrotliCompressFragmentTwoPass
                    (puVar12,uVar3,is_last,this->command_buf_,this->literal_buf_,table,table_size,
                     &storage_ix,storage);
        }
        this->last_byte_ = storage[storage_ix >> 3];
        this->last_byte_bits_ = (byte)storage_ix & 7;
        this->last_processed_pos_ = this->input_pos_;
        *output = storage;
        *out_size = storage_ix >> 3;
      }
    }
    else {
      sVar7 = this->num_commands_;
      uVar3 = (uVar9 >> 1 & 0x7fffffff) + sVar7 + 1;
      if (this->cmd_alloc_size_ < uVar3) {
        uVar6 = uVar9 >> 2 & 0x3fffffff;
        this->cmd_alloc_size_ = uVar3 + uVar6 + 0x10;
        pCVar4 = (Command *)realloc(this->commands_,((uVar6 + uVar3) * 8 + 0x80) * 3);
        this->commands_ = pCVar4;
        uVar10 = this->last_processed_pos_;
        quality = (this->params_).quality;
        sVar7 = this->num_commands_;
      }
      else {
        pCVar4 = this->commands_;
      }
      uVar8 = (uint)uVar10 & 0x3fffffff | 0x40000000;
      if (uVar10 < 0x40000001) {
        uVar8 = (uint)uVar10;
      }
      uVar5 = (this->params_).lgwin;
      local_50 = (ulong)uVar5;
      local_58 = (ulong)(uint)this->hash_type_;
      local_60 = &this->num_literals_;
      CreateBackwardReferences
                (uVar9 & 0xffffffff,(ulong)uVar8,is_last,puVar12,(ulong)uVar1,quality,uVar5,
                 this->hashers_,this->hash_type_,this->dist_cache_,&this->last_insert_len_,
                 pCVar4 + sVar7,&this->num_commands_,local_60);
      uVar8 = 0x1000000;
      if (uVar1 + 1 < 0x1000000) {
        uVar8 = uVar1 + 1;
      }
      if ((force_flush || is_last) ||
         ((((this->params_).quality < 4 && (0x2ffe < this->num_commands_ + *local_60)) ||
          ((ulong)uVar8 + this->last_flush_pos_ <
           (1L << ((byte)(this->params_).lgblock & 0x3f)) + this->input_pos_)))) {
        sVar7 = this->last_insert_len_;
        if (sVar7 != 0) {
          Command::Command((Command *)&storage_ix,sVar7);
          pCVar4 = this->commands_;
          sVar7 = this->num_commands_;
          this->num_commands_ = sVar7 + 1;
          pCVar2 = pCVar4 + sVar7;
          pCVar2->dist_extra_ = local_38;
          pCVar2->cmd_prefix_ = uStack_34;
          pCVar2->dist_prefix_ = uStack_32;
          pCVar4 = pCVar4 + sVar7;
          pCVar4->insert_len_ = (undefined4)storage_ix;
          pCVar4->copy_len_ = storage_ix._4_4_;
          pCVar4->cmd_extra_ = uStack_40;
          this->num_literals_ = this->num_literals_ + this->last_insert_len_;
          this->last_insert_len_ = 0;
        }
        WriteMetaBlockInternal(this,is_last,out_size,output);
      }
      else {
        this->last_processed_pos_ = this->input_pos_;
        *out_size = 0;
      }
    }
  }
  return uVar9 <= uVar11;
}

Assistant:

bool BrotliCompressor::WriteBrotliData(const bool is_last,
                                       const bool force_flush,
                                       size_t* out_size,
                                       uint8_t** output) {
  const uint64_t delta = input_pos_ - last_processed_pos_;
  const uint8_t* data = ringbuffer_->start();
  const uint32_t mask = ringbuffer_->mask();

  if (delta > input_block_size()) {
    return false;
  }
  const uint32_t bytes = static_cast<uint32_t>(delta);

  if (params_.quality <= 1) {
    if (delta == 0 && !is_last) {
      // We have no new input data and we don't have to finish the stream, so
      // nothing to do.
      *out_size = 0;
      return true;
    }
    const size_t max_out_size = 2 * bytes + 500;
    uint8_t* storage = GetBrotliStorage(max_out_size);
    storage[0] = last_byte_;
    size_t storage_ix = last_byte_bits_;
    size_t table_size;
    int* table = GetHashTable(params_.quality, bytes, &table_size);
    if (params_.quality == 0) {
      BrotliCompressFragmentFast(
          &data[WrapPosition(last_processed_pos_) & mask],
          bytes, is_last,
          table, table_size,
          cmd_depths_, cmd_bits_,
          &cmd_code_numbits_, cmd_code_,
          &storage_ix, storage);
    } else {
      BrotliCompressFragmentTwoPass(
          &data[WrapPosition(last_processed_pos_) & mask],
          bytes, is_last,
          command_buf_, literal_buf_,
          table, table_size,
          &storage_ix, storage);
    }
    last_byte_ = storage[storage_ix >> 3];
    last_byte_bits_ = storage_ix & 7u;
    last_processed_pos_ = input_pos_;
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return true;
  }

  // Theoretical max number of commands is 1 per 2 bytes.
  size_t newsize = num_commands_ + bytes / 2 + 1;
  if (newsize > cmd_alloc_size_) {
    // Reserve a bit more memory to allow merging with a next block
    // without realloc: that would impact speed.
    newsize += (bytes / 4) + 16;
    cmd_alloc_size_ = newsize;
    commands_ =
        static_cast<Command*>(realloc(commands_, sizeof(Command) * newsize));
  }

  CreateBackwardReferences(bytes, WrapPosition(last_processed_pos_),
                           is_last, data, mask,
                           params_.quality,
                           params_.lgwin,
                           hashers_,
                           hash_type_,
                           dist_cache_,
                           &last_insert_len_,
                           &commands_[num_commands_],
                           &num_commands_,
                           &num_literals_);

  size_t max_length = std::min<size_t>(mask + 1, 1u << kMaxInputBlockBits);
  if (!is_last && !force_flush &&
      (params_.quality >= kMinQualityForBlockSplit ||
       (num_literals_ + num_commands_ < kMaxNumDelayedSymbols)) &&
      input_pos_ + input_block_size() <= last_flush_pos_ + max_length) {
    // Merge with next input block. Everything will happen later.
    last_processed_pos_ = input_pos_;
    *out_size = 0;
    return true;
  }

  // Create the last insert-only command.
  if (last_insert_len_ > 0) {
    brotli::Command cmd(last_insert_len_);
    commands_[num_commands_++] = cmd;
    num_literals_ += last_insert_len_;
    last_insert_len_ = 0;
  }

  WriteMetaBlockInternal(is_last, out_size, output);
  return true;
}